

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_builder.cpp
# Opt level: O2

void __thiscall ccs::RuleBuilder::Impl::set(Impl *this,string *name,string *value)

{
  pointer *__ptr;
  AstRule *local_48;
  _Head_base<0UL,_ccs::ast::AstRule_*,_false> local_40;
  StringVal local_38;
  
  std::make_unique<ccs::ast::PropDef>();
  std::__cxx11::string::_M_assign((string *)(local_48 + 1));
  StringVal::StringVal(&local_38,value);
  Value::setString((Value *)(local_48 + 5),&local_38);
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::~vector(&local_38.elements_);
  local_40._M_head_impl = local_48;
  std::
  vector<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>,std::allocator<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>>>
  ::emplace_back<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>>
            ((vector<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>,std::allocator<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>>>
              *)&((this->ast)._M_t.
                  super___uniq_ptr_impl<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_ccs::ast::Nested_*,_std::default_delete<ccs::ast::Nested>_>
                  .super__Head_base<0UL,_ccs::ast::Nested_*,_false>._M_head_impl)->rules_,
             (unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_> *)&local_40);
  if (local_40._M_head_impl != (AstRule *)0x0) {
    (*(local_40._M_head_impl)->_vptr_AstRule[1])();
  }
  return;
}

Assistant:

void set(const std::string &name, const std::string &value) {
    auto def = std::make_unique<ast::PropDef>();
    def->name_ = name;
    def->value_.setString(StringVal(value));
    ast->addRule(std::move(def));
  }